

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OneWireAnalyzerSettings.cpp
# Opt level: O0

bool __thiscall OneWireAnalyzerSettings::SetSettingsFromInterfaces(OneWireAnalyzerSettings *this)

{
  byte bVar1;
  Channel local_20 [16];
  OneWireAnalyzerSettings *local_10;
  OneWireAnalyzerSettings *this_local;
  
  local_10 = this;
  std::auto_ptr<AnalyzerSettingInterfaceChannel>::operator->(&this->mOneWireChannelInterface);
  AnalyzerSettingInterfaceChannel::GetChannel();
  Channel::operator=(&this->mOneWireChannel,local_20);
  Channel::~Channel(local_20);
  std::auto_ptr<AnalyzerSettingInterfaceBool>::operator->(&this->mOverDriveInterface);
  bVar1 = AnalyzerSettingInterfaceBool::GetValue();
  this->mOverdrive = (bool)(bVar1 & 1);
  AnalyzerSettings::ClearChannels();
  AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mOneWireChannel,true);
  return true;
}

Assistant:

bool OneWireAnalyzerSettings::SetSettingsFromInterfaces()
{
    mOneWireChannel = mOneWireChannelInterface->GetChannel();
    mOverdrive = mOverDriveInterface->GetValue();

    ClearChannels();
    AddChannel( mOneWireChannel, "1-WIRE", true );

    return true;
}